

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O0

void __thiscall Pl_Base64::flush_encode(Pl_Base64 *this)

{
  uchar uVar1;
  Pipeline *pPVar2;
  ulong local_30;
  size_t i_1;
  ulong uStack_20;
  int ch;
  size_t i;
  uchar out [4];
  int outval;
  Pl_Base64 *this_local;
  
  i._4_4_ = (uint)this->buf[0] << 0x10 | (uint)this->buf[1] << 8 | (uint)this->buf[2];
  _out = this;
  i._0_1_ = to_uc((int)i._4_4_ >> 0x12);
  i._1_1_ = to_uc((int)i._4_4_ >> 0xc & 0x3f);
  i._2_1_ = to_uc((int)i._4_4_ >> 6 & 0x3f);
  i._3_1_ = to_uc(i._4_4_ & 0x3f);
  for (uStack_20 = 0; uStack_20 < 4; uStack_20 = uStack_20 + 1) {
    i_1._4_4_ = to_i((uint)out[uStack_20 - 8]);
    if (i_1._4_4_ < 0x1a) {
      i_1._4_4_ = i_1._4_4_ + 0x41;
    }
    else if (i_1._4_4_ < 0x34) {
      i_1._4_4_ = i_1._4_4_ + 0x47;
    }
    else if (i_1._4_4_ < 0x3e) {
      i_1._4_4_ = i_1._4_4_ + -4;
    }
    else if (i_1._4_4_ == 0x3e) {
      i_1._4_4_ = 0x2b;
    }
    else if (i_1._4_4_ == 0x3f) {
      i_1._4_4_ = 0x2f;
    }
    uVar1 = to_uc(i_1._4_4_);
    out[uStack_20 - 8] = uVar1;
  }
  for (local_30 = 0; local_30 < 3 - this->pos; local_30 = local_30 + 1) {
    out[-5 - local_30] = '=';
  }
  pPVar2 = Pipeline::next(&this->super_Pipeline);
  (*pPVar2->_vptr_Pipeline[2])(pPVar2,&i,4);
  return;
}

Assistant:

void
Pl_Base64::flush_encode()
{
    int outval = ((this->buf[0] << 16) | (this->buf[1] << 8) | (this->buf[2]));
    unsigned char out[4] = {
        to_uc(outval >> 18),
        to_uc(0x3f & (outval >> 12)),
        to_uc(0x3f & (outval >> 6)),
        to_uc(0x3f & outval),
    };
    for (size_t i = 0; i < 4; ++i) {
        int ch = to_i(out[i]);
        if (ch < 26) {
            ch += 'A';
        } else if (ch < 52) {
            ch -= 26;
            ch += 'a';
        } else if (ch < 62) {
            ch -= 52;
            ch += '0';
        } else if (ch == 62) {
            ch = '+';
        } else if (ch == 63) {
            ch = '/';
        }
        out[i] = to_uc(ch);
    }
    for (size_t i = 0; i < 3 - this->pos; ++i) {
        out[3 - i] = '=';
    }
    next()->write(out, 4);
}